

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolverTypes.h
# Opt level: O0

CRef __thiscall
Minisat::ClauseAllocator::alloc<Minisat::Clause>(ClauseAllocator *this,Clause *ps,bool learnt)

{
  int size;
  Ref RVar1;
  undefined1 in_DL;
  Clause *in_RSI;
  long in_RDI;
  CRef cid;
  int extras;
  Ref in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  uint uVar2;
  uint extras_00;
  undefined3 in_stack_ffffffffffffffec;
  uint uVar3;
  
  uVar3 = CONCAT13(in_DL,in_stack_ffffffffffffffec) & 0x1ffffff;
  if ((char)(uVar3 >> 0x18) == '\0') {
    uVar2 = (uint)(*(byte *)(in_RDI + 0x14) & 1);
  }
  else {
    uVar2 = 2;
  }
  extras_00 = uVar2;
  size = Clause::size(in_RSI);
  clauseWord32Size(size,extras_00);
  RVar1 = RegionAllocator<unsigned_int>::alloc
                    ((RegionAllocator<unsigned_int> *)CONCAT44(uVar2,in_stack_ffffffffffffffd0),
                     in_stack_ffffffffffffffcc);
  lea((ClauseAllocator *)CONCAT44(uVar2,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffcc);
  Clause::Clause<Minisat::Clause>
            (in_RSI,(Clause *)CONCAT44(uVar3,extras_00),SUB41(RVar1 >> 0x18,0),
             SUB41(RVar1 >> 0x10,0));
  return RVar1;
}

Assistant:

CRef alloc(const Lits &ps, bool learnt = false)
    {
        assert(sizeof(Lit) == sizeof(uint32_t));
        assert(sizeof(float) == sizeof(uint32_t));
        int extras = learnt ? 2 : (int)extra_clause_field;

        CRef cid = RegionAllocator<uint32_t>::alloc(clauseWord32Size(ps.size(), extras));
        new (lea(cid)) Clause(ps, extra_clause_field, learnt);

        return cid;
    }